

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O2

void __thiscall cmsys::Glob::AddExpression(Glob *this,string *expr)

{
  GlobInternals *pGVar1;
  string local_30;
  
  pGVar1 = this->Internals;
  PatternToRegex(&local_30,expr,true,false);
  std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
  emplace_back<std::__cxx11::string>
            ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
             &pGVar1->Expressions,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Glob::AddExpression(const std::string& expr)
{
  this->Internals->Expressions.emplace_back(this->PatternToRegex(expr));
}